

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

void __thiscall Lodtalk::AST::MethodAST::~MethodAST(MethodAST *this)

{
  (this->super_FunctionalNode).super_Node._vptr_Node = (_func_int **)&PTR__MethodAST_001641c0;
  if (this->header != (MethodHeader *)0x0) {
    (*(this->header->super_Node)._vptr_Node[1])();
  }
  if (this->pragmaList != (PragmaList *)0x0) {
    (*(this->pragmaList->super_Node)._vptr_Node[1])();
  }
  if (this->body != (SequenceNode *)0x0) {
    (*(this->body->super_Node)._vptr_Node[1])();
  }
  OopRef::unregisterSelf(&(this->astHandle).reference);
  (this->super_FunctionalNode).super_Node._vptr_Node = (_func_int **)&PTR__FunctionalNode_00164580;
  std::
  vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
  ::~vector(&(this->super_FunctionalNode).localVariables);
  return;
}

Assistant:

MethodAST::~MethodAST()
{
	delete header;
    delete pragmaList;
	delete body;
}